

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O1

size_t __thiscall
boost::asio::detail::
timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::cancel_timer(timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
               *this,per_timer_data *timer,op_queue<boost::asio::detail::scheduler_operation> *ops,
              size_t max_cancelled)

{
  wait_op *pwVar1;
  wait_op *pwVar2;
  wait_op *pwVar3;
  scheduler_operation *psVar4;
  wait_op *tmp;
  error_category *peVar5;
  scheduler_operation *psVar6;
  size_t sVar7;
  bool bVar8;
  
  if ((timer->prev_ == (per_timer_data *)0x0) && (this->timers_ != timer)) {
    sVar7 = 0;
  }
  else {
    sVar7 = 0;
    do {
      bVar8 = sVar7 != max_cancelled;
      pwVar1 = (timer->op_queue_).front_;
      if (pwVar1 != (wait_op *)0x0 && bVar8) {
        peVar5 = system::system_category();
        (pwVar1->ec_).m_val = 0x7d;
        (pwVar1->ec_).m_cat = peVar5;
        pwVar2 = (timer->op_queue_).front_;
        if (pwVar2 != (wait_op *)0x0) {
          pwVar3 = (wait_op *)(pwVar2->super_operation).next_;
          (timer->op_queue_).front_ = pwVar3;
          if (pwVar3 == (wait_op *)0x0) {
            (timer->op_queue_).back_ = (wait_op *)0x0;
          }
          (pwVar2->super_operation).next_ = (scheduler_operation *)0x0;
        }
        (pwVar1->super_operation).next_ = (scheduler_operation *)0x0;
        psVar4 = ops->back_;
        psVar6 = psVar4;
        if (psVar4 == (scheduler_operation *)0x0) {
          psVar6 = (scheduler_operation *)&ops->back_;
        }
        psVar6->next_ = &pwVar1->super_operation;
        (&ops->front_)[psVar4 != (scheduler_operation *)0x0] = &pwVar1->super_operation;
        sVar7 = sVar7 + 1;
      }
    } while (pwVar1 != (wait_op *)0x0 && bVar8);
    if ((timer->op_queue_).front_ == (wait_op *)0x0) {
      remove_timer(this,timer);
    }
  }
  return sVar7;
}

Assistant:

std::size_t cancel_timer(per_timer_data& timer, op_queue<operation>& ops,
      std::size_t max_cancelled = (std::numeric_limits<std::size_t>::max)())
  {
    std::size_t num_cancelled = 0;
    if (timer.prev_ != 0 || &timer == timers_)
    {
      while (wait_op* op = (num_cancelled != max_cancelled)
          ? timer.op_queue_.front() : 0)
      {
        op->ec_ = boost::asio::error::operation_aborted;
        timer.op_queue_.pop();
        ops.push(op);
        ++num_cancelled;
      }
      if (timer.op_queue_.empty())
        remove_timer(timer);
    }
    return num_cancelled;
  }